

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

int Gia_ManFactorGraph(Gia_Man_t *p,Dec_Graph_t *pFForm,Vec_Int_t *vLeaves)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (0 < pFForm->nLeaves) {
    lVar2 = 2;
    lVar3 = 0;
    do {
      if (vLeaves->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((int)*(Dec_Edge_t *)(vLeaves->pArray + lVar3) < 0) {
        __assert_fail("Vec_IntEntry(vLeaves, i) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                      ,0x6a,"int Gia_ManFactorGraph(Gia_Man_t *, Dec_Graph_t *, Vec_Int_t *)");
      }
      (&pFForm->pNodes->eEdge0)[lVar2] = *(Dec_Edge_t *)(vLeaves->pArray + lVar3);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 6;
    } while (lVar3 < pFForm->nLeaves);
  }
  iVar1 = Gia_ManGraphToAig(p,pFForm);
  return iVar1;
}

Assistant:

int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves )
{
    Dec_Node_t * pFFNode;
    int i, Lit;
    // assign fanins
    Dec_GraphForEachLeaf( pFForm, pFFNode, i )
    {
        assert( Vec_IntEntry(vLeaves, i) >= 0 );
        pFFNode->iFunc = Vec_IntEntry(vLeaves, i);
    }
    // perform strashing
    Lit = Gia_ManGraphToAig( p, pFForm );
    return Lit;
}